

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall Server::do_timer(Server *this)

{
  int iVar1;
  const_iterator cVar2;
  long *plVar3;
  mapped_type pvVar4;
  mapped_type *ppvVar5;
  code *pcVar6;
  long *plVar7;
  key_type *__k;
  long lVar8;
  long *plVar9;
  itimerspec it;
  long lStack_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  Server *pSStack_48;
  undefined1 local_28 [24];
  long local_10;
  
  lVar8 = 1;
  __k = (key_type *)0x800;
  iVar1 = timerfd_create(1,0x800);
  this->timer_fd = iVar1;
  if (iVar1 < 0) {
    do_timer();
  }
  else {
    __k = (key_type *)(local_28 + 0x10);
    lVar8 = 1;
    iVar1 = clock_gettime(1,(timespec *)__k);
    if (-1 < iVar1) {
      local_28._16_8_ = 1;
      local_10 = 0;
      local_28._0_8_ = 1;
      local_28._8_8_ = 0;
      timerfd_settime(this->timer_fd,0,(itimerspec *)local_28,(itimerspec *)0x0);
      return;
    }
  }
  do_timer();
  pSStack_48 = this;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&available_modules_abi_cxx11_._M_t,__k);
  if ((_Rb_tree_header *)cVar2._M_node !=
      &available_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::operator+(&bStack_68,"libmodule_",__k);
    plVar3 = (long *)std::__cxx11::string::append((char *)&bStack_68);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      lStack_78 = *plVar7;
      uStack_70 = (undefined4)plVar3[3];
      uStack_6c = *(undefined4 *)((long)plVar3 + 0x1c);
      plVar9 = &lStack_78;
    }
    else {
      lStack_78 = *plVar7;
      plVar9 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pvVar4 = (mapped_type)dlopen(plVar9,2);
    if (plVar9 != &lStack_78) {
      operator_delete(plVar9);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bStack_68._M_dataplus._M_p != &bStack_68.field_2) {
      operator_delete(bStack_68._M_dataplus._M_p);
    }
    ppvVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                            *)(lVar8 + 0xb0),__k);
    *ppvVar5 = pvVar4;
    pcVar6 = (code *)dlsym(pvVar4,"module_load");
    (*pcVar6)(lVar8);
  }
  return;
}

Assistant:

void Server::do_timer() {
    this->timer_fd = timerfd_create(CLOCK_MONOTONIC, TFD_NONBLOCK);
    IF_NEGATIVE_EXIT(this->timer_fd);
    struct itimerspec it;
    IF_NEGATIVE_EXIT(clock_gettime(CLOCK_MONOTONIC, &it.it_value));
    it.it_value.tv_sec = 1;
    it.it_value.tv_nsec = 0;
    it.it_interval.tv_sec = 1;
    it.it_interval.tv_nsec = 0;
    timerfd_settime(this->timer_fd, 0, &it, NULL);
}